

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LzmaEnc_SaveState(CLzmaEncHandle pp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long in_RDI;
  int i;
  CSaveState *dest;
  CLzmaEnc *p;
  int local_1c;
  
  memcpy((void *)(in_RDI + 0x3d9c8),(void *)(in_RDI + 0x342b8),0x4848);
  memcpy((void *)(in_RDI + 0x42210),(void *)(in_RDI + 0x38b00),0x4848);
  *(undefined4 *)(in_RDI + 0x3d350) = *(undefined4 *)(in_RDI + 0x5c);
  for (local_1c = 0; local_1c < 0xc; local_1c = local_1c + 1) {
    puVar1 = (undefined8 *)(in_RDI + 0x3d364 + (long)local_1c * 0x20);
    puVar2 = (undefined8 *)(in_RDI + 0x33c54 + (long)local_1c * 0x20);
    *puVar1 = *puVar2;
    puVar1[1] = puVar2[1];
    puVar1[2] = puVar2[2];
    puVar1[3] = puVar2[3];
    puVar1 = (undefined8 *)(in_RDI + 0x3d544 + (long)local_1c * 0x20);
    puVar2 = (undefined8 *)(in_RDI + 0x33e34 + (long)local_1c * 0x20);
    *puVar1 = *puVar2;
    puVar1[1] = puVar2[1];
    puVar1[2] = puVar2[2];
    puVar1[3] = puVar2[3];
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    memcpy((void *)(in_RDI + 0x3d6c4 + (long)local_1c * 0x80),
           (void *)(in_RDI + 0x33fb4 + (long)local_1c * 0x80),0x80);
  }
  *(undefined8 *)(in_RDI + 0x3d4e4) = *(undefined8 *)(in_RDI + 0x33dd4);
  *(undefined8 *)(in_RDI + 0x3d4ec) = *(undefined8 *)(in_RDI + 0x33ddc);
  *(undefined8 *)(in_RDI + 0x3d4f4) = *(undefined8 *)(in_RDI + 0x33de4);
  *(undefined8 *)(in_RDI + 0x3d4fc) = *(undefined8 *)(in_RDI + 0x33dec);
  *(undefined8 *)(in_RDI + 0x3d504) = *(undefined8 *)(in_RDI + 0x33df4);
  *(undefined8 *)(in_RDI + 0x3d50c) = *(undefined8 *)(in_RDI + 0x33dfc);
  *(undefined8 *)(in_RDI + 0x3d514) = *(undefined8 *)(in_RDI + 0x33e04);
  *(undefined8 *)(in_RDI + 0x3d51c) = *(undefined8 *)(in_RDI + 0x33e0c);
  *(undefined8 *)(in_RDI + 0x3d524) = *(undefined8 *)(in_RDI + 0x33e14);
  *(undefined8 *)(in_RDI + 0x3d52c) = *(undefined8 *)(in_RDI + 0x33e1c);
  *(undefined8 *)(in_RDI + 0x3d534) = *(undefined8 *)(in_RDI + 0x33e24);
  *(undefined8 *)(in_RDI + 0x3d53c) = *(undefined8 *)(in_RDI + 0x33e2c);
  memcpy((void *)(in_RDI + 0x3d8c4),(void *)(in_RDI + 0x341b4),0xe4);
  *(undefined8 *)(in_RDI + 0x3d9a8) = *(undefined8 *)(in_RDI + 0x34298);
  *(undefined8 *)(in_RDI + 0x3d9b0) = *(undefined8 *)(in_RDI + 0x342a0);
  *(undefined8 *)(in_RDI + 0x3d9b8) = *(undefined8 *)(in_RDI + 0x342a8);
  *(undefined8 *)(in_RDI + 0x3d9c0) = *(undefined8 *)(in_RDI + 0x342b0);
  *(undefined8 *)(in_RDI + 0x3d354) = *(undefined8 *)(in_RDI + 0x4c);
  *(undefined8 *)(in_RDI + 0x3d35c) = *(undefined8 *)(in_RDI + 0x54);
  memcpy(*(void **)(in_RDI + 0x3d348),*(void **)(in_RDI + 0x78),
         (ulong)(uint)(0x300 << ((byte)*(undefined4 *)(in_RDI + 0x74) & 0x1f)) << 1);
  return;
}

Assistant:

void LzmaEnc_SaveState(CLzmaEncHandle pp)
{
  CLzmaEnc *p = (CLzmaEnc *)pp;
  CSaveState *dest = &p->saveState;
  int i;
  dest->lenEnc = p->lenEnc;
  dest->repLenEnc = p->repLenEnc;
  dest->state = p->state;

  for (i = 0; i < kNumStates; i++)
  {
    memcpy(dest->isMatch[i], p->isMatch[i], sizeof(p->isMatch[i]));
    memcpy(dest->isRep0Long[i], p->isRep0Long[i], sizeof(p->isRep0Long[i]));
  }
  for (i = 0; i < kNumLenToPosStates; i++)
    memcpy(dest->posSlotEncoder[i], p->posSlotEncoder[i], sizeof(p->posSlotEncoder[i]));
  memcpy(dest->isRep, p->isRep, sizeof(p->isRep));
  memcpy(dest->isRepG0, p->isRepG0, sizeof(p->isRepG0));
  memcpy(dest->isRepG1, p->isRepG1, sizeof(p->isRepG1));
  memcpy(dest->isRepG2, p->isRepG2, sizeof(p->isRepG2));
  memcpy(dest->posEncoders, p->posEncoders, sizeof(p->posEncoders));
  memcpy(dest->posAlignEncoder, p->posAlignEncoder, sizeof(p->posAlignEncoder));
  memcpy(dest->reps, p->reps, sizeof(p->reps));
  memcpy(dest->litProbs, p->litProbs, ((UInt32)0x300 << p->lclp) * sizeof(CLzmaProb));
}